

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtk.cpp
# Opt level: O0

vector<float,_std::allocator<float>_> * sdf_tools::io::getFloatData(Grid *grid)

{
  bool bVar1;
  vector<float,_std::allocator<float>_> *this;
  reference pfVar2;
  Grid *in_RSI;
  vector<float,_std::allocator<float>_> *in_RDI;
  float val;
  const_iterator __end2;
  const_iterator __begin2;
  vector<float,_std::allocator<float>_> *__range2;
  vector<float,_std::allocator<float>_> *data;
  vector<float,_std::allocator<float>_> *d;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff98;
  vector<float,_std::allocator<float>_> *__x;
  undefined4 in_stack_ffffffffffffffb0;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> local_40;
  size_type in_stack_ffffffffffffffc8;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffffd0;
  
  __x = in_RDI;
  this = Grid::getData(in_RSI);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x135579);
  std::vector<float,_std::allocator<float>_>::size(this);
  std::vector<float,_std::allocator<float>_>::reserve
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  local_40._M_current =
       (float *)std::vector<float,_std::allocator<float>_>::begin(in_stack_ffffffffffffff98);
  std::vector<float,_std::allocator<float>_>::end(in_stack_ffffffffffffff98);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>
                             *)in_stack_ffffffffffffff98), bVar1) {
    pfVar2 = __gnu_cxx::
             __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator*(&local_40);
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)CONCAT44(*pfVar2,in_stack_ffffffffffffffb0),
               (value_type_conflict1 *)__x);
    __gnu_cxx::__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>::
    operator++(&local_40);
  }
  return in_RDI;
}

Assistant:

static std::vector<float> getFloatData(const Grid *grid)
{
    const auto& data = grid->getData();
    std::vector<float> d;
    d.reserve(data.size());

    for (auto val : data)
        d.push_back(val);

    return d;
}